

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall
CTPNStmCompBase::CTPNStmCompBase(CTPNStmCompBase *this,CTPNStm *first_stm,CTcPrsSymtab *symtab)

{
  CTcTokenizer *pCVar1;
  
  CTPNStmBase::CTPNStmBase((CTPNStmBase *)this);
  (this->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
       = (_func_int **)&PTR_gen_code_003198d0;
  this->first_stm_ = first_stm;
  this->symtab_ = symtab;
  this->field_0x40 = this->field_0x40 & 0xfe;
  pCVar1 = G_tok;
  this->end_desc_ = G_tok->last_desc_;
  this->end_linenum_ = pCVar1->last_linenum_;
  return;
}

Assistant:

CTPNStmCompBase::CTPNStmCompBase(CTPNStm *first_stm, CTcPrsSymtab *symtab)
{
    /* remember the first statement in our statement list */
    first_stm_ = first_stm;
    
    /* remember our local symbol table */
    symtab_ = symtab;
    
    /* 
     *   presume we don't have our own private symbol table, but will
     *   simply use our parent's 
     */
    has_own_scope_ = FALSE;

    /* 
     *   remember the source location of the closing brace, which should
     *   be the current location when we're instantiated 
     */
    end_desc_ = G_tok->get_last_desc();
    end_linenum_ = G_tok->get_last_linenum();
}